

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

int __thiscall asl::Array<asl::WebSocket_*>::remove(Array<asl::WebSocket_*> *this,char *__filename)

{
  int iVar1;
  Data *pDVar2;
  uint in_EDX;
  int n;
  int iVar3;
  int m;
  int n_local;
  int i_local;
  Array<asl::WebSocket_*> *this_local;
  
  iVar3 = (int)__filename;
  pDVar2 = d(this);
  iVar1 = pDVar2->n;
  if ((int)(iVar3 + in_EDX) <= iVar1) {
    asl_destroy<asl::WebSocket*>((asl *)(this->_a + iVar3),(WebSocket **)(ulong)in_EDX,n);
    memmove(this->_a + iVar3,this->_a + (long)iVar3 + (long)(int)in_EDX,
            (long)(int)((iVar1 - iVar3) - in_EDX) << 3);
    pDVar2 = d(this);
    pDVar2->n = pDVar2->n - in_EDX;
    resize(this,iVar1 - in_EDX);
  }
  return (int)this;
}

Assistant:

Array& remove(int i, int n = 1)
	{
		int m = d().n;
		if (i + n > m)
			return *this;
		asl_destroy(_a+i, n);
		memmove((char*)(_a + i), _a + i + n, (m - i - n)*sizeof(T));
		d().n -= n;
		resize(m - n);
		return *this;
	}